

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Mish_x86_fma::forward_inplace(Mish_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float __x;
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  undefined1 (*pauVar5) [32];
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float fStack_40;
  
  iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar10 = 0;
  uVar9 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar9 = uVar10;
  }
  for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
    pvVar1 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    pauVar5 = (undefined1 (*) [32])(sVar3 * uVar10 * sVar2 + (long)pvVar1);
    lVar8 = 0;
    for (iVar7 = 0; iVar7 + 7 < iVar6; iVar7 = iVar7 + 8) {
      auVar13 = *pauVar5;
      auVar85._8_4_ = 0x42b0c0a5;
      auVar85._0_8_ = 0x42b0c0a542b0c0a5;
      auVar85._12_4_ = 0x42b0c0a5;
      auVar85._16_4_ = 0x42b0c0a5;
      auVar85._20_4_ = 0x42b0c0a5;
      auVar85._24_4_ = 0x42b0c0a5;
      auVar85._28_4_ = 0x42b0c0a5;
      auVar19 = vminps_avx(auVar13,auVar85);
      auVar88._8_4_ = 0xc2b0c0a5;
      auVar88._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar88._12_4_ = 0xc2b0c0a5;
      auVar88._16_4_ = 0xc2b0c0a5;
      auVar88._20_4_ = 0xc2b0c0a5;
      auVar88._24_4_ = 0xc2b0c0a5;
      auVar88._28_4_ = 0xc2b0c0a5;
      auVar20 = vmaxps_avx(auVar88,auVar19);
      auVar92._8_4_ = 0x3fb8aa3b;
      auVar92._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar92._12_4_ = 0x3fb8aa3b;
      auVar92._16_4_ = 0x3fb8aa3b;
      auVar92._20_4_ = 0x3fb8aa3b;
      auVar92._24_4_ = 0x3fb8aa3b;
      auVar92._28_4_ = 0x3fb8aa3b;
      auVar90._8_4_ = 0x3f000000;
      auVar90._0_8_ = 0x3f0000003f000000;
      auVar90._12_4_ = 0x3f000000;
      auVar90._16_4_ = 0x3f000000;
      auVar90._20_4_ = 0x3f000000;
      auVar90._24_4_ = 0x3f000000;
      auVar90._28_4_ = 0x3f000000;
      auVar14 = vfmadd213ps_fma(auVar92,auVar20,auVar90);
      auVar18 = vroundps_avx(ZEXT1632(auVar14),1);
      auVar19 = vcmpps_avx(ZEXT1632(auVar14),auVar18,1);
      auVar94._8_4_ = 0x3f800000;
      auVar94._0_8_ = 0x3f8000003f800000;
      auVar94._12_4_ = 0x3f800000;
      auVar94._16_4_ = 0x3f800000;
      auVar94._20_4_ = 0x3f800000;
      auVar94._24_4_ = 0x3f800000;
      auVar94._28_4_ = 0x3f800000;
      auVar19 = vandps_avx(auVar94,auVar19);
      auVar19 = vsubps_avx(auVar18,auVar19);
      auVar96._8_4_ = 0x3f318000;
      auVar96._0_8_ = 0x3f3180003f318000;
      auVar96._12_4_ = 0x3f318000;
      auVar96._16_4_ = 0x3f318000;
      auVar96._20_4_ = 0x3f318000;
      auVar96._24_4_ = 0x3f318000;
      auVar96._28_4_ = 0x3f318000;
      auVar14 = vfmsub231ps_fma(auVar20,auVar19,auVar96);
      auVar98._8_4_ = 0xb95e8083;
      auVar98._0_8_ = 0xb95e8083b95e8083;
      auVar98._12_4_ = 0xb95e8083;
      auVar98._16_4_ = 0xb95e8083;
      auVar98._20_4_ = 0xb95e8083;
      auVar98._24_4_ = 0xb95e8083;
      auVar98._28_4_ = 0xb95e8083;
      auVar23 = vfnmsub231ps_fma(ZEXT1632(auVar14),auVar19,auVar98);
      auVar17 = ZEXT1632(auVar23);
      auVar20._28_4_ = auVar18._28_4_;
      auVar20._0_28_ =
           ZEXT1628(CONCAT412(auVar23._12_4_ * auVar23._12_4_,
                              CONCAT48(auVar23._8_4_ * auVar23._8_4_,
                                       CONCAT44(auVar23._4_4_ * auVar23._4_4_,
                                                auVar23._0_4_ * auVar23._0_4_))));
      auVar102._8_4_ = 0x39506967;
      auVar102._0_8_ = 0x3950696739506967;
      auVar102._12_4_ = 0x39506967;
      auVar102._16_4_ = 0x39506967;
      auVar102._20_4_ = 0x39506967;
      auVar102._24_4_ = 0x39506967;
      auVar102._28_4_ = 0x39506967;
      auVar100._8_4_ = 0x3ab743ce;
      auVar100._0_8_ = 0x3ab743ce3ab743ce;
      auVar100._12_4_ = 0x3ab743ce;
      auVar100._16_4_ = 0x3ab743ce;
      auVar100._20_4_ = 0x3ab743ce;
      auVar100._24_4_ = 0x3ab743ce;
      auVar100._28_4_ = 0x3ab743ce;
      auVar14 = vfmadd213ps_fma(auVar102,auVar17,auVar100);
      auVar56._8_4_ = 0x3c088908;
      auVar56._0_8_ = 0x3c0889083c088908;
      auVar56._12_4_ = 0x3c088908;
      auVar56._16_4_ = 0x3c088908;
      auVar56._20_4_ = 0x3c088908;
      auVar56._24_4_ = 0x3c088908;
      auVar56._28_4_ = 0x3c088908;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar17,auVar56);
      auVar57._8_4_ = 0x3d2aa9c1;
      auVar57._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar57._12_4_ = 0x3d2aa9c1;
      auVar57._16_4_ = 0x3d2aa9c1;
      auVar57._20_4_ = 0x3d2aa9c1;
      auVar57._24_4_ = 0x3d2aa9c1;
      auVar57._28_4_ = 0x3d2aa9c1;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar17,auVar57);
      auVar58._8_4_ = 0x3e2aaaaa;
      auVar58._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar58._12_4_ = 0x3e2aaaaa;
      auVar58._16_4_ = 0x3e2aaaaa;
      auVar58._20_4_ = 0x3e2aaaaa;
      auVar58._24_4_ = 0x3e2aaaaa;
      auVar58._28_4_ = 0x3e2aaaaa;
      auVar18 = ZEXT1632(auVar23);
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar18,auVar58);
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar18,auVar90);
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar20,auVar18);
      auVar40._0_4_ = auVar14._0_4_ + 1.0;
      auVar40._4_4_ = auVar14._4_4_ + 1.0;
      auVar40._8_4_ = auVar14._8_4_ + 1.0;
      auVar40._12_4_ = auVar14._12_4_ + 1.0;
      auVar40._16_4_ = 0x3f800000;
      auVar40._20_4_ = 0x3f800000;
      auVar40._24_4_ = 0x3f800000;
      auVar40._28_4_ = 0x3f800000;
      auVar14._0_4_ = (int)auVar19._0_4_;
      auVar14._4_4_ = (int)auVar19._4_4_;
      auVar14._8_4_ = (int)auVar19._8_4_;
      auVar14._12_4_ = (int)auVar19._12_4_;
      auVar17._16_4_ = (int)auVar19._16_4_;
      auVar17._0_16_ = auVar14;
      auVar17._20_4_ = (int)auVar19._20_4_;
      auVar17._24_4_ = (int)auVar19._24_4_;
      auVar17._28_4_ = (int)auVar19._28_4_;
      auVar23 = vpslld_avx(auVar14,0x17);
      auVar14 = vpslld_avx(auVar17._16_16_,0x17);
      auVar12._8_4_ = 0x3f800000;
      auVar12._0_8_ = 0x3f8000003f800000;
      auVar12._12_4_ = 0x3f800000;
      auVar14 = vpaddd_avx(auVar14,auVar12);
      auVar23 = vpaddd_avx(auVar23,auVar12);
      auVar19._16_16_ = auVar14;
      auVar19._0_16_ = auVar23;
      auVar36 = vfmadd213ps_fma(auVar19,auVar40,auVar94);
      auVar28._8_4_ = 0x800000;
      auVar28._0_8_ = 0x80000000800000;
      auVar28._12_4_ = 0x800000;
      auVar28._16_4_ = 0x800000;
      auVar28._20_4_ = 0x800000;
      auVar28._24_4_ = 0x800000;
      auVar28._28_4_ = 0x800000;
      auVar19 = vmaxps_avx(ZEXT1632(auVar36),auVar28);
      auVar23 = vpsrld_avx(auVar19._0_16_,0x17);
      auVar14 = vpsrld_avx(auVar19._16_16_,0x17);
      auVar59._8_4_ = 0x807fffff;
      auVar59._0_8_ = 0x807fffff807fffff;
      auVar59._12_4_ = 0x807fffff;
      auVar59._16_4_ = 0x807fffff;
      auVar59._20_4_ = 0x807fffff;
      auVar59._24_4_ = 0x807fffff;
      auVar59._28_4_ = 0x807fffff;
      auVar19 = vandps_avx(auVar19,auVar59);
      auVar18 = vorps_avx(auVar90,auVar19);
      auVar60._8_4_ = 0x3f3504f3;
      auVar60._0_8_ = 0x3f3504f33f3504f3;
      auVar60._12_4_ = 0x3f3504f3;
      auVar60._16_4_ = 0x3f3504f3;
      auVar60._20_4_ = 0x3f3504f3;
      auVar60._24_4_ = 0x3f3504f3;
      auVar60._28_4_ = 0x3f3504f3;
      auVar20 = vcmpps_avx(auVar60,auVar18,2);
      auVar19 = vandnps_avx(auVar20,auVar18);
      auVar86._8_4_ = 0xbf800000;
      auVar86._0_8_ = 0xbf800000bf800000;
      auVar86._12_4_ = 0xbf800000;
      auVar86._16_4_ = 0xbf800000;
      auVar86._20_4_ = 0xbf800000;
      auVar86._24_4_ = 0xbf800000;
      auVar86._28_4_ = 0xbf800000;
      auVar29._0_4_ = auVar18._0_4_ + -1.0 + auVar19._0_4_;
      auVar29._4_4_ = auVar18._4_4_ + -1.0 + auVar19._4_4_;
      auVar29._8_4_ = auVar18._8_4_ + -1.0 + auVar19._8_4_;
      auVar29._12_4_ = auVar18._12_4_ + -1.0 + auVar19._12_4_;
      auVar29._16_4_ = auVar18._16_4_ + -1.0 + auVar19._16_4_;
      auVar29._20_4_ = auVar18._20_4_ + -1.0 + auVar19._20_4_;
      auVar29._24_4_ = auVar18._24_4_ + -1.0 + auVar19._24_4_;
      auVar29._28_4_ = auVar18._28_4_ + -1.0 + auVar19._28_4_;
      auVar14 = vpsubd_avx(auVar14,auVar20._16_16_);
      auVar64._8_4_ = 0xffffff81;
      auVar64._0_8_ = 0xffffff81ffffff81;
      auVar64._12_4_ = 0xffffff81;
      auVar14 = vpaddd_avx(auVar14,auVar64);
      auVar23 = vpsubd_avx(auVar23,auVar20._0_16_);
      auVar23 = vpaddd_avx(auVar23,auVar64);
      auVar41._16_16_ = auVar14;
      auVar41._0_16_ = auVar23;
      auVar47._0_4_ = auVar29._0_4_ * auVar29._0_4_;
      auVar47._4_4_ = auVar29._4_4_ * auVar29._4_4_;
      auVar47._8_4_ = auVar29._8_4_ * auVar29._8_4_;
      auVar47._12_4_ = auVar29._12_4_ * auVar29._12_4_;
      auVar47._16_4_ = auVar29._16_4_ * auVar29._16_4_;
      auVar47._20_4_ = auVar29._20_4_ * auVar29._20_4_;
      auVar47._24_4_ = auVar29._24_4_ * auVar29._24_4_;
      auVar47._28_4_ = 0;
      auVar61._8_4_ = 0x3d9021bb;
      auVar61._0_8_ = 0x3d9021bb3d9021bb;
      auVar61._12_4_ = 0x3d9021bb;
      auVar61._16_4_ = 0x3d9021bb;
      auVar61._20_4_ = 0x3d9021bb;
      auVar61._24_4_ = 0x3d9021bb;
      auVar61._28_4_ = 0x3d9021bb;
      auVar73._8_4_ = 0xbdebd1b8;
      auVar73._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar73._12_4_ = 0xbdebd1b8;
      auVar73._16_4_ = 0xbdebd1b8;
      auVar73._20_4_ = 0xbdebd1b8;
      auVar73._24_4_ = 0xbdebd1b8;
      auVar73._28_4_ = 0xbdebd1b8;
      auVar14 = vfmadd213ps_fma(auVar61,auVar29,auVar73);
      auVar74._8_4_ = 0x3def251a;
      auVar74._0_8_ = 0x3def251a3def251a;
      auVar74._12_4_ = 0x3def251a;
      auVar74._16_4_ = 0x3def251a;
      auVar74._20_4_ = 0x3def251a;
      auVar74._24_4_ = 0x3def251a;
      auVar74._28_4_ = 0x3def251a;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar29,auVar74);
      auVar75._8_4_ = 0xbdfe5d4f;
      auVar75._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar75._12_4_ = 0xbdfe5d4f;
      auVar75._16_4_ = 0xbdfe5d4f;
      auVar75._20_4_ = 0xbdfe5d4f;
      auVar75._24_4_ = 0xbdfe5d4f;
      auVar75._28_4_ = 0xbdfe5d4f;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar29,auVar75);
      auVar76._8_4_ = 0x3e11e9bf;
      auVar76._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar76._12_4_ = 0x3e11e9bf;
      auVar76._16_4_ = 0x3e11e9bf;
      auVar76._20_4_ = 0x3e11e9bf;
      auVar76._24_4_ = 0x3e11e9bf;
      auVar76._28_4_ = 0x3e11e9bf;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar29,auVar76);
      auVar77._8_4_ = 0xbe2aae50;
      auVar77._0_8_ = 0xbe2aae50be2aae50;
      auVar77._12_4_ = 0xbe2aae50;
      auVar77._16_4_ = 0xbe2aae50;
      auVar77._20_4_ = 0xbe2aae50;
      auVar77._24_4_ = 0xbe2aae50;
      auVar77._28_4_ = 0xbe2aae50;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar29,auVar77);
      auVar78._8_4_ = 0x3e4cceac;
      auVar78._0_8_ = 0x3e4cceac3e4cceac;
      auVar78._12_4_ = 0x3e4cceac;
      auVar78._16_4_ = 0x3e4cceac;
      auVar78._20_4_ = 0x3e4cceac;
      auVar78._24_4_ = 0x3e4cceac;
      auVar78._28_4_ = 0x3e4cceac;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar29,auVar78);
      auVar79._8_4_ = 0xbe7ffffc;
      auVar79._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar79._12_4_ = 0xbe7ffffc;
      auVar79._16_4_ = 0xbe7ffffc;
      auVar79._20_4_ = 0xbe7ffffc;
      auVar79._24_4_ = 0xbe7ffffc;
      auVar79._28_4_ = 0xbe7ffffc;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar29,auVar79);
      auVar80._8_4_ = 0x3eaaaaaa;
      auVar80._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar80._12_4_ = 0x3eaaaaaa;
      auVar80._16_4_ = 0x3eaaaaaa;
      auVar80._20_4_ = 0x3eaaaaaa;
      auVar80._24_4_ = 0x3eaaaaaa;
      auVar80._28_4_ = 0x3eaaaaaa;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar29,auVar80);
      auVar62._0_4_ = auVar47._0_4_ * auVar29._0_4_ * auVar14._0_4_;
      auVar62._4_4_ = auVar47._4_4_ * auVar29._4_4_ * auVar14._4_4_;
      auVar62._8_4_ = auVar47._8_4_ * auVar29._8_4_ * auVar14._8_4_;
      auVar62._12_4_ = auVar47._12_4_ * auVar29._12_4_ * auVar14._12_4_;
      auVar62._16_4_ = auVar47._16_4_ * auVar29._16_4_ * 0.0;
      auVar62._20_4_ = auVar47._20_4_ * auVar29._20_4_ * 0.0;
      auVar62._24_4_ = auVar47._24_4_ * auVar29._24_4_ * 0.0;
      auVar62._28_4_ = 0;
      auVar20 = vcvtdq2ps_avx(auVar41);
      auVar14 = vfmadd231ps_fma(auVar62,auVar20,auVar98);
      auVar14 = vfmsub231ps_fma(ZEXT1632(auVar14),auVar90,auVar47);
      auVar19 = vcmpps_avx(ZEXT1632(auVar36),_DAT_0053a9c0,2);
      auVar18 = vsubps_avx(ZEXT1632(auVar14),auVar29);
      auVar14 = vfmsub231ps_fma(auVar18,auVar96,auVar20);
      auVar63._8_4_ = 0xc0000000;
      auVar63._0_8_ = 0xc0000000c0000000;
      auVar63._12_4_ = 0xc0000000;
      auVar63._16_4_ = 0xc0000000;
      auVar63._20_4_ = 0xc0000000;
      auVar63._24_4_ = 0xc0000000;
      auVar63._28_4_ = 0xc0000000;
      auVar30._0_4_ = auVar14._0_4_ * -2.0;
      auVar30._4_4_ = auVar14._4_4_ * -2.0;
      auVar30._8_4_ = auVar14._8_4_ * -2.0;
      auVar30._12_4_ = auVar14._12_4_ * -2.0;
      auVar30._16_4_ = 0x80000000;
      auVar30._20_4_ = 0x80000000;
      auVar30._24_4_ = 0x80000000;
      auVar30._28_4_ = 0;
      auVar42._8_4_ = 0x7fffffff;
      auVar42._0_8_ = 0x7fffffff7fffffff;
      auVar42._12_4_ = 0x7fffffff;
      auVar42._16_4_ = 0x7fffffff;
      auVar42._20_4_ = 0x7fffffff;
      auVar42._24_4_ = 0x7fffffff;
      auVar42._28_4_ = 0x7fffffff;
      auVar19 = vblendvps_avx(auVar30,auVar42,auVar19);
      auVar31._8_4_ = 0x42b0c0a5;
      auVar31._0_8_ = 0x42b0c0a542b0c0a5;
      auVar31._12_4_ = 0x42b0c0a5;
      auVar31._16_4_ = 0x42b0c0a5;
      auVar31._20_4_ = 0x42b0c0a5;
      auVar31._24_4_ = 0x42b0c0a5;
      auVar31._28_4_ = 0x42b0c0a5;
      auVar19 = vminps_avx(auVar19,auVar31);
      auVar20 = vmaxps_avx(auVar88,auVar19);
      auVar14 = vfmadd213ps_fma(auVar92,auVar20,auVar90);
      auVar18 = vroundps_avx(ZEXT1632(auVar14),1);
      auVar19 = vcmpps_avx(ZEXT1632(auVar14),auVar18,1);
      auVar19 = vandps_avx(auVar94,auVar19);
      auVar19 = vsubps_avx(auVar18,auVar19);
      auVar14 = vfmsub231ps_fma(auVar20,auVar19,auVar96);
      auVar23 = vfnmsub231ps_fma(ZEXT1632(auVar14),auVar19,auVar98);
      auVar20 = ZEXT1632(auVar23);
      auVar18._28_4_ = auVar18._28_4_;
      auVar18._0_28_ =
           ZEXT1628(CONCAT412(auVar23._12_4_ * auVar23._12_4_,
                              CONCAT48(auVar23._8_4_ * auVar23._8_4_,
                                       CONCAT44(auVar23._4_4_ * auVar23._4_4_,
                                                auVar23._0_4_ * auVar23._0_4_))));
      auVar14 = vfmadd213ps_fma(auVar102,auVar20,auVar100);
      auVar81._8_4_ = 0x3c088908;
      auVar81._0_8_ = 0x3c0889083c088908;
      auVar81._12_4_ = 0x3c088908;
      auVar81._16_4_ = 0x3c088908;
      auVar81._20_4_ = 0x3c088908;
      auVar81._24_4_ = 0x3c088908;
      auVar81._28_4_ = 0x3c088908;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar20,auVar81);
      auVar82._8_4_ = 0x3d2aa9c1;
      auVar82._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar82._12_4_ = 0x3d2aa9c1;
      auVar82._16_4_ = 0x3d2aa9c1;
      auVar82._20_4_ = 0x3d2aa9c1;
      auVar82._24_4_ = 0x3d2aa9c1;
      auVar82._28_4_ = 0x3d2aa9c1;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar20,auVar82);
      auVar83._8_4_ = 0x3e2aaaaa;
      auVar83._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar83._12_4_ = 0x3e2aaaaa;
      auVar83._16_4_ = 0x3e2aaaaa;
      auVar83._20_4_ = 0x3e2aaaaa;
      auVar83._24_4_ = 0x3e2aaaaa;
      auVar83._28_4_ = 0x3e2aaaaa;
      auVar20 = ZEXT1632(auVar23);
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar20,auVar83);
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar20,auVar90);
      auVar36 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar18,auVar20);
      auVar23._0_4_ = (int)auVar19._0_4_;
      auVar23._4_4_ = (int)auVar19._4_4_;
      auVar23._8_4_ = (int)auVar19._8_4_;
      auVar23._12_4_ = (int)auVar19._12_4_;
      auVar21._16_4_ = (int)auVar19._16_4_;
      auVar21._0_16_ = auVar23;
      auVar21._20_4_ = (int)auVar19._20_4_;
      auVar21._24_4_ = (int)auVar19._24_4_;
      auVar21._28_4_ = (int)auVar19._28_4_;
      auVar23 = vpslld_avx(auVar23,0x17);
      auVar14 = vpslld_avx(auVar21._16_16_,0x17);
      auVar14 = vpaddd_avx(auVar14,auVar12);
      auVar23 = vpaddd_avx(auVar23,auVar12);
      auVar22._16_16_ = auVar14;
      auVar22._0_16_ = auVar23;
      auVar32._0_4_ = auVar36._0_4_ + 1.0;
      auVar32._4_4_ = auVar36._4_4_ + 1.0;
      auVar32._8_4_ = auVar36._8_4_ + 1.0;
      auVar32._12_4_ = auVar36._12_4_ + 1.0;
      auVar32._16_4_ = 0x3f800000;
      auVar32._20_4_ = 0x3f800000;
      auVar32._24_4_ = 0x3f800000;
      auVar32._28_4_ = 0x3f800000;
      auVar14 = vfmadd213ps_fma(auVar22,auVar32,auVar94);
      auVar19 = vdivps_avx(auVar94,ZEXT1632(auVar14));
      auVar14 = vfnmadd213ps_fma(auVar19,auVar63,auVar86);
      local_58 = auVar13._0_4_;
      fStack_54 = auVar13._4_4_;
      fStack_50 = auVar13._8_4_;
      fStack_4c = auVar13._12_4_;
      fStack_48 = auVar13._16_4_;
      fStack_44 = auVar13._20_4_;
      fStack_40 = auVar13._24_4_;
      auVar13._0_4_ = auVar14._0_4_ * local_58;
      auVar13._4_4_ = auVar14._4_4_ * fStack_54;
      auVar13._8_4_ = auVar14._8_4_ * fStack_50;
      auVar13._12_4_ = auVar14._12_4_ * fStack_4c;
      auVar13._16_4_ = fStack_48 * 0.0;
      auVar13._20_4_ = fStack_44 * 0.0;
      auVar13._24_4_ = fStack_40 * 0.0;
      auVar13._28_4_ = 0;
      *pauVar5 = auVar13;
      pauVar5 = pauVar5 + 1;
      lVar8 = lVar8 + 8;
    }
    for (; iVar7 + 3 < iVar6; iVar7 = iVar7 + 4) {
      auVar14 = *(undefined1 (*) [16])*pauVar5;
      auVar87._8_4_ = 0x42b0c0a5;
      auVar87._0_8_ = 0x42b0c0a542b0c0a5;
      auVar87._12_4_ = 0x42b0c0a5;
      auVar23 = vminps_avx(auVar87,auVar14);
      auVar89._8_4_ = 0xc2b0c0a5;
      auVar89._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar89._12_4_ = 0xc2b0c0a5;
      auVar12 = vmaxps_avx(auVar89,auVar23);
      auVar91._8_4_ = 0x3fb8aa3b;
      auVar91._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar91._12_4_ = 0x3fb8aa3b;
      auVar93._8_4_ = 0x3f000000;
      auVar93._0_8_ = 0x3f0000003f000000;
      auVar93._12_4_ = 0x3f000000;
      auVar23 = vfmadd213ps_fma(auVar91,auVar12,auVar93);
      auVar33._0_4_ = (int)auVar23._0_4_;
      auVar33._4_4_ = (int)auVar23._4_4_;
      auVar33._8_4_ = (int)auVar23._8_4_;
      auVar33._12_4_ = (int)auVar23._12_4_;
      auVar36 = vcvtdq2ps_avx(auVar33);
      auVar23 = vcmpps_avx(auVar23,auVar36,1);
      auVar84._8_4_ = 0x3f800000;
      auVar84._0_8_ = 0x3f8000003f800000;
      auVar84._12_4_ = 0x3f800000;
      auVar23 = vandps_avx(auVar23,auVar84);
      auVar23 = vsubps_avx(auVar36,auVar23);
      auVar95._8_4_ = 0x3f318000;
      auVar95._0_8_ = 0x3f3180003f318000;
      auVar95._12_4_ = 0x3f318000;
      auVar36 = vfmsub231ps_fma(auVar12,auVar23,auVar95);
      auVar97._8_4_ = 0xb95e8083;
      auVar97._0_8_ = 0xb95e8083b95e8083;
      auVar97._12_4_ = 0xb95e8083;
      auVar12 = vfnmsub231ps_fma(auVar36,auVar23,auVar97);
      auVar34._0_4_ = auVar12._0_4_ * auVar12._0_4_;
      auVar34._4_4_ = auVar12._4_4_ * auVar12._4_4_;
      auVar34._8_4_ = auVar12._8_4_ * auVar12._8_4_;
      auVar34._12_4_ = auVar12._12_4_ * auVar12._12_4_;
      auVar101._8_4_ = 0x39506967;
      auVar101._0_8_ = 0x3950696739506967;
      auVar101._12_4_ = 0x39506967;
      auVar99._8_4_ = 0x3ab743ce;
      auVar99._0_8_ = 0x3ab743ce3ab743ce;
      auVar99._12_4_ = 0x3ab743ce;
      auVar36 = vfmadd213ps_fma(auVar101,auVar12,auVar99);
      auVar48._8_4_ = 0x3c088908;
      auVar48._0_8_ = 0x3c0889083c088908;
      auVar48._12_4_ = 0x3c088908;
      auVar36 = vfmadd213ps_fma(auVar36,auVar12,auVar48);
      auVar49._8_4_ = 0x3d2aa9c1;
      auVar49._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar49._12_4_ = 0x3d2aa9c1;
      auVar36 = vfmadd213ps_fma(auVar36,auVar12,auVar49);
      auVar50._8_4_ = 0x3e2aaaaa;
      auVar50._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar50._12_4_ = 0x3e2aaaaa;
      auVar36 = vfmadd213ps_fma(auVar36,auVar12,auVar50);
      auVar36 = vfmadd213ps_fma(auVar36,auVar12,auVar93);
      auVar36 = vfmadd213ps_fma(auVar36,auVar34,auVar12);
      auVar35._0_4_ = auVar36._0_4_ + 1.0;
      auVar35._4_4_ = auVar36._4_4_ + 1.0;
      auVar35._8_4_ = auVar36._8_4_ + 1.0;
      auVar35._12_4_ = auVar36._12_4_ + 1.0;
      auVar36._0_4_ = (int)auVar23._0_4_;
      auVar36._4_4_ = (int)auVar23._4_4_;
      auVar36._8_4_ = (int)auVar23._8_4_;
      auVar36._12_4_ = (int)auVar23._12_4_;
      auVar23 = vpslld_avx(auVar36,0x17);
      auVar23 = vpaddd_avx(auVar23,auVar84);
      auVar15 = vfmadd213ps_fma(auVar23,auVar35,auVar84);
      auVar24._8_4_ = 0x800000;
      auVar24._0_8_ = 0x80000000800000;
      auVar24._12_4_ = 0x800000;
      auVar23 = vmaxps_avx(auVar15,auVar24);
      auVar36 = vpsrld_avx(auVar23,0x17);
      auVar43._8_4_ = 0xffffff82;
      auVar43._0_8_ = 0xffffff82ffffff82;
      auVar43._12_4_ = 0xffffff82;
      auVar36 = vpaddd_avx(auVar36,auVar43);
      auVar44._8_4_ = 0x807fffff;
      auVar44._0_8_ = 0x807fffff807fffff;
      auVar44._12_4_ = 0x807fffff;
      auVar23 = vandps_avx(auVar23,auVar44);
      auVar64 = vorps_avx(auVar93,auVar23);
      auVar12 = vcvtdq2ps_avx(auVar36);
      auVar45._8_4_ = 0x3f3504f3;
      auVar45._0_8_ = 0x3f3504f33f3504f3;
      auVar45._12_4_ = 0x3f3504f3;
      auVar36 = vcmpps_avx(auVar64,auVar45,1);
      auVar23 = vandps_avx(auVar36,auVar64);
      auVar25._0_4_ = auVar64._0_4_ + -1.0 + auVar23._0_4_;
      auVar25._4_4_ = auVar64._4_4_ + -1.0 + auVar23._4_4_;
      auVar25._8_4_ = auVar64._8_4_ + -1.0 + auVar23._8_4_;
      auVar25._12_4_ = auVar64._12_4_ + -1.0 + auVar23._12_4_;
      auVar23 = vandps_avx(auVar36,auVar84);
      auVar36 = vsubps_avx(auVar12,auVar23);
      auVar46._0_4_ = auVar25._0_4_ * auVar25._0_4_;
      auVar46._4_4_ = auVar25._4_4_ * auVar25._4_4_;
      auVar46._8_4_ = auVar25._8_4_ * auVar25._8_4_;
      auVar46._12_4_ = auVar25._12_4_ * auVar25._12_4_;
      auVar51._8_4_ = 0x3d9021bb;
      auVar51._0_8_ = 0x3d9021bb3d9021bb;
      auVar51._12_4_ = 0x3d9021bb;
      auVar65._8_4_ = 0xbdebd1b8;
      auVar65._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar65._12_4_ = 0xbdebd1b8;
      auVar23 = vfmadd213ps_fma(auVar51,auVar25,auVar65);
      auVar66._8_4_ = 0x3def251a;
      auVar66._0_8_ = 0x3def251a3def251a;
      auVar66._12_4_ = 0x3def251a;
      auVar23 = vfmadd213ps_fma(auVar23,auVar25,auVar66);
      auVar67._8_4_ = 0xbdfe5d4f;
      auVar67._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar67._12_4_ = 0xbdfe5d4f;
      auVar23 = vfmadd213ps_fma(auVar23,auVar25,auVar67);
      auVar68._8_4_ = 0x3e11e9bf;
      auVar68._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar68._12_4_ = 0x3e11e9bf;
      auVar23 = vfmadd213ps_fma(auVar23,auVar25,auVar68);
      auVar69._8_4_ = 0xbe2aae50;
      auVar69._0_8_ = 0xbe2aae50be2aae50;
      auVar69._12_4_ = 0xbe2aae50;
      auVar23 = vfmadd213ps_fma(auVar23,auVar25,auVar69);
      auVar70._8_4_ = 0x3e4cceac;
      auVar70._0_8_ = 0x3e4cceac3e4cceac;
      auVar70._12_4_ = 0x3e4cceac;
      auVar23 = vfmadd213ps_fma(auVar23,auVar25,auVar70);
      auVar71._8_4_ = 0xbe7ffffc;
      auVar71._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar71._12_4_ = 0xbe7ffffc;
      auVar23 = vfmadd213ps_fma(auVar23,auVar25,auVar71);
      auVar72._8_4_ = 0x3eaaaaaa;
      auVar72._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar72._12_4_ = 0x3eaaaaaa;
      auVar23 = vfmadd213ps_fma(auVar23,auVar25,auVar72);
      auVar52._0_4_ = auVar46._0_4_ * auVar25._0_4_ * auVar23._0_4_;
      auVar52._4_4_ = auVar46._4_4_ * auVar25._4_4_ * auVar23._4_4_;
      auVar52._8_4_ = auVar46._8_4_ * auVar25._8_4_ * auVar23._8_4_;
      auVar52._12_4_ = auVar46._12_4_ * auVar25._12_4_ * auVar23._12_4_;
      auVar23 = vfmadd231ps_fma(auVar52,auVar36,auVar97);
      auVar12 = vfmsub231ps_fma(auVar23,auVar93,auVar46);
      auVar23 = vcmpps_avx(auVar15,_DAT_005371b0,2);
      auVar12 = vsubps_avx(auVar12,auVar25);
      auVar36 = vfnmadd231ps_fma(auVar12,auVar95,auVar36);
      auVar26._0_4_ = auVar36._0_4_ + auVar36._0_4_;
      auVar26._4_4_ = auVar36._4_4_ + auVar36._4_4_;
      auVar26._8_4_ = auVar36._8_4_ + auVar36._8_4_;
      auVar26._12_4_ = auVar36._12_4_ + auVar36._12_4_;
      auVar37._8_4_ = 0x7fffffff;
      auVar37._0_8_ = 0x7fffffff7fffffff;
      auVar37._12_4_ = 0x7fffffff;
      auVar23 = vblendvps_avx(auVar26,auVar37,auVar23);
      auVar23 = vminps_avx(auVar87,auVar23);
      auVar12 = vmaxps_avx(auVar89,auVar23);
      auVar23 = vfmadd213ps_fma(auVar91,auVar12,auVar93);
      auVar38._0_4_ = (int)auVar23._0_4_;
      auVar38._4_4_ = (int)auVar23._4_4_;
      auVar38._8_4_ = (int)auVar23._8_4_;
      auVar38._12_4_ = (int)auVar23._12_4_;
      auVar36 = vcvtdq2ps_avx(auVar38);
      auVar23 = vcmpps_avx(auVar23,auVar36,1);
      auVar23 = vandps_avx(auVar23,auVar84);
      auVar23 = vsubps_avx(auVar36,auVar23);
      auVar36 = vfmsub231ps_fma(auVar12,auVar23,auVar95);
      auVar12 = vfnmsub231ps_fma(auVar36,auVar23,auVar97);
      auVar39._0_4_ = auVar12._0_4_ * auVar12._0_4_;
      auVar39._4_4_ = auVar12._4_4_ * auVar12._4_4_;
      auVar39._8_4_ = auVar12._8_4_ * auVar12._8_4_;
      auVar39._12_4_ = auVar12._12_4_ * auVar12._12_4_;
      auVar36 = vfmadd213ps_fma(auVar101,auVar12,auVar99);
      auVar53._8_4_ = 0x3c088908;
      auVar53._0_8_ = 0x3c0889083c088908;
      auVar53._12_4_ = 0x3c088908;
      auVar36 = vfmadd213ps_fma(auVar36,auVar12,auVar53);
      auVar54._8_4_ = 0x3d2aa9c1;
      auVar54._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar54._12_4_ = 0x3d2aa9c1;
      auVar36 = vfmadd213ps_fma(auVar36,auVar12,auVar54);
      auVar55._8_4_ = 0x3e2aaaaa;
      auVar55._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar55._12_4_ = 0x3e2aaaaa;
      auVar36 = vfmadd213ps_fma(auVar36,auVar12,auVar55);
      auVar36 = vfmadd213ps_fma(auVar36,auVar12,auVar93);
      auVar36 = vfmadd213ps_fma(auVar36,auVar39,auVar12);
      auVar15._0_4_ = auVar36._0_4_ + 1.0;
      auVar15._4_4_ = auVar36._4_4_ + 1.0;
      auVar15._8_4_ = auVar36._8_4_ + 1.0;
      auVar15._12_4_ = auVar36._12_4_ + 1.0;
      auVar27._0_4_ = (int)auVar23._0_4_;
      auVar27._4_4_ = (int)auVar23._4_4_;
      auVar27._8_4_ = (int)auVar23._8_4_;
      auVar27._12_4_ = (int)auVar23._12_4_;
      auVar23 = vpslld_avx(auVar27,0x17);
      auVar23 = vpaddd_avx(auVar23,auVar84);
      auVar23 = vfmadd213ps_fma(auVar23,auVar15,auVar84);
      auVar16._8_4_ = 0x40000000;
      auVar16._0_8_ = 0x4000000040000000;
      auVar16._12_4_ = 0x40000000;
      auVar23 = vdivps_avx(auVar16,auVar23);
      auVar14 = vfmsub213ps_fma(auVar23,auVar14,auVar14);
      *(undefined1 (*) [16])*pauVar5 = auVar14;
      pauVar5 = (undefined1 (*) [32])(*pauVar5 + 0x10);
      lVar8 = lVar8 + 4;
    }
    lVar4 = sVar3 * sVar2 * uVar10;
    for (; (int)lVar8 < iVar6; lVar8 = lVar8 + 1) {
      __x = *(float *)((long)pvVar1 + lVar8 * 4 + lVar4);
      fVar11 = expf(__x);
      fVar11 = logf(fVar11 + 1.0);
      fVar11 = tanhf(fVar11);
      *(float *)((long)pvVar1 + lVar8 * 4 + lVar4) = fVar11 * __x;
    }
  }
  return 0;
}

Assistant:

int Mish_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = mish_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}